

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::IsContinuationOfLowWorkHeadersSync
          (PeerManagerImpl *this,Peer *peer,CNode *pfrom,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers)

{
  unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *this_00;
  NodeId *__k;
  long lVar1;
  HeadersSyncState *this_01;
  pointer pCVar2;
  pointer pCVar3;
  pointer pCVar4;
  bool bVar5;
  common_comparison_category_t<__detail::__synth3way_t<arith_uint256>,___detail::__synth3way_t<optional<pair<long,_unsigned_int>_>_>_>
  cVar6;
  mapped_type *this_02;
  iterator iVar7;
  long lVar8;
  _Base_ptr p_Var9;
  CNode *pCVar10;
  unique_lock<std::mutex> *this_03;
  pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *__y;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  NodeId local_c0;
  ProcessingResult local_b8;
  CBlockLocator locator;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock62;
  bool local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (peer->m_headers_sync)._M_t.
            super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
            super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
            super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl;
  if (this_01 == (HeadersSyncState *)0x0) {
    local_b8.success = false;
    goto LAB_001b8660;
  }
  HeadersSyncState::ProcessNextHeaders
            (&local_b8,this_01,headers,
             (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                   _M_impl.super__Vector_impl_data._M_start == 160000);
  if (local_b8.success == true) {
    (peer->m_last_getheaders_timestamp).__d.__r = 0;
  }
  this_00 = &peer->m_headers_sync;
  if (local_b8.request_more == true) {
    HeadersSyncState::NextHeadersRequestLocator
              (&locator,(this_00->_M_t).
                        super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>
                        .super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl);
    if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start !=
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pCVar10 = pfrom;
      MaybeSendGetHeaders(this,pfrom,&locator,peer);
      bVar5 = ::LogAcceptCategory(NET,(Level)pCVar10);
      if (bVar5) {
        base_blob<256u>::ToString_abi_cxx11_
                  ((string *)&criticalblock62,
                   (base_blob<256u> *)
                   locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start);
        local_c0 = pfrom->id;
        logging_function._M_str = "IsContinuationOfLowWorkHeadersSync";
        logging_function._M_len = 0x22;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x5b;
        LogPrintf_<std::__cxx11::string,long>
                  (logging_function,source_file,0xaf4,NET,Debug,
                   "more getheaders (from %s) to peer=%d\n",(string *)&criticalblock62,&local_c0);
        std::__cxx11::string::~string((string *)&criticalblock62);
      }
    }
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
              ((_Vector_base<uint256,_std::allocator<uint256>_> *)&locator);
  }
  if (((this_00->_M_t).
       super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
       super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
       super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl)->m_download_state == FINAL) {
    std::__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
              ((__uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)this_00,
               (pointer)0x0);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (&criticalblock62,&this->m_headers_presync_mutex,"m_headers_presync_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
               ,0xafe,false);
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pfrom->id;
    std::
    _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
    ::erase(&(this->m_headers_presync_stats)._M_t,(key_type_conflict *)&locator);
    this_03 = &criticalblock62.super_unique_lock;
  }
  else {
    std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>::
    pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>,_true>
              ((pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
               &criticalblock62);
    base_uint<256U>::base_uint
              ((base_uint<256U> *)&locator,
               &(((this_00->_M_t).
                  super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>
                  .super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl)->
                m_current_chain_work).super_base_uint<256U>);
    base_uint<256U>::operator=((base_uint<256U> *)&criticalblock62,(base_uint<256U> *)&locator);
    if (((this_00->_M_t).
         super___uniq_ptr_impl<HeadersSyncState,_std::default_delete<HeadersSyncState>_>._M_t.
         super__Tuple_impl<0UL,_HeadersSyncState_*,_std::default_delete<HeadersSyncState>_>.
         super__Head_base<0UL,_HeadersSyncState_*,_false>._M_head_impl)->m_download_state == PRESYNC
       ) {
      if (local_40 == false) {
        local_40 = true;
      }
    }
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&locator,&this->m_headers_presync_mutex,
               "m_headers_presync_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
               ,0xb0a,false);
    local_c0 = pfrom->id;
    this_02 = std::
              map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
              ::operator[](&this->m_headers_presync_stats,&local_c0);
    std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>::operator=
              (this_02,(type)&criticalblock62);
    __k = &this->m_headers_presync_bestpeer;
    iVar7 = std::
            _Rb_tree<long,_std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
            ::find(&(this->m_headers_presync_stats)._M_t,__k);
    if ((_Rb_tree_header *)iVar7._M_node ==
        &(this->m_headers_presync_stats)._M_t._M_impl.super__Rb_tree_header) {
      lVar8 = -1;
      __y = (pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)0x0;
      for (p_Var9 = (this->m_headers_presync_stats)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left; p_Var9 != iVar7._M_node;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
        if (__y == (pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)0x0) {
LAB_001b85de:
          lVar8 = *(long *)(p_Var9 + 1);
          __y = (pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
                &p_Var9[1]._M_parent;
        }
        else {
          cVar6 = std::operator<=><arith_uint256,std::optional<std::pair<long,unsigned_int>>>
                            ((pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
                             &p_Var9[1]._M_parent,__y);
          if ('\0' < cVar6._M_value) goto LAB_001b85de;
        }
      }
      *__k = lVar8;
      if (lVar8 == pfrom->id) goto LAB_001b860c;
    }
    else {
      lVar8 = *(long *)(iVar7._M_node + 1);
      if (lVar8 != pfrom->id) {
        cVar6 = std::operator<=><arith_uint256,std::optional<std::pair<long,unsigned_int>>>
                          ((pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
                           &criticalblock62,
                           (pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
                           &iVar7._M_node[1]._M_parent);
        if (cVar6._M_value < '\x01') goto LAB_001b861f;
        lVar8 = pfrom->id;
      }
      *__k = lVar8;
LAB_001b860c:
      if (local_40 == true) {
        LOCK();
        (this->m_headers_presync_should_signal)._M_base._M_i = true;
        UNLOCK();
      }
    }
LAB_001b861f:
    this_03 = (unique_lock<std::mutex> *)&locator;
  }
  std::unique_lock<std::mutex>::~unique_lock(this_03);
  if (local_b8.success == true) {
    pCVar2 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b8.pow_validated_headers.
         super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pCVar3 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pCVar4 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_b8.pow_validated_headers.
         super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
         super__Vector_impl_data._M_start;
    (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.pow_validated_headers.
         super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_b8.pow_validated_headers.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
    _M_impl.super__Vector_impl_data._M_start = pCVar3;
    local_b8.pow_validated_headers.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
    _M_impl.super__Vector_impl_data._M_finish = pCVar4;
    local_b8.pow_validated_headers.super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = pCVar2;
  }
  std::_Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>::~_Vector_base
            ((_Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_> *)&local_b8);
LAB_001b8660:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_b8.success;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::IsContinuationOfLowWorkHeadersSync(Peer& peer, CNode& pfrom, std::vector<CBlockHeader>& headers)
{
    if (peer.m_headers_sync) {
        auto result = peer.m_headers_sync->ProcessNextHeaders(headers, headers.size() == MAX_HEADERS_RESULTS);
        // If it is a valid continuation, we should treat the existing getheaders request as responded to.
        if (result.success) peer.m_last_getheaders_timestamp = {};
        if (result.request_more) {
            auto locator = peer.m_headers_sync->NextHeadersRequestLocator();
            // If we were instructed to ask for a locator, it should not be empty.
            Assume(!locator.vHave.empty());
            // We can only be instructed to request more if processing was successful.
            Assume(result.success);
            if (!locator.vHave.empty()) {
                // It should be impossible for the getheaders request to fail,
                // because we just cleared the last getheaders timestamp.
                bool sent_getheaders = MaybeSendGetHeaders(pfrom, locator, peer);
                Assume(sent_getheaders);
                LogDebug(BCLog::NET, "more getheaders (from %s) to peer=%d\n",
                    locator.vHave.front().ToString(), pfrom.GetId());
            }
        }

        if (peer.m_headers_sync->GetState() == HeadersSyncState::State::FINAL) {
            peer.m_headers_sync.reset(nullptr);

            // Delete this peer's entry in m_headers_presync_stats.
            // If this is m_headers_presync_bestpeer, it will be replaced later
            // by the next peer that triggers the else{} branch below.
            LOCK(m_headers_presync_mutex);
            m_headers_presync_stats.erase(pfrom.GetId());
        } else {
            // Build statistics for this peer's sync.
            HeadersPresyncStats stats;
            stats.first = peer.m_headers_sync->GetPresyncWork();
            if (peer.m_headers_sync->GetState() == HeadersSyncState::State::PRESYNC) {
                stats.second = {peer.m_headers_sync->GetPresyncHeight(),
                                peer.m_headers_sync->GetPresyncTime()};
            }

            // Update statistics in stats.
            LOCK(m_headers_presync_mutex);
            m_headers_presync_stats[pfrom.GetId()] = stats;
            auto best_it = m_headers_presync_stats.find(m_headers_presync_bestpeer);
            bool best_updated = false;
            if (best_it == m_headers_presync_stats.end()) {
                // If the cached best peer is outdated, iterate over all remaining ones (including
                // newly updated one) to find the best one.
                NodeId peer_best{-1};
                const HeadersPresyncStats* stat_best{nullptr};
                for (const auto& [peer, stat] : m_headers_presync_stats) {
                    if (!stat_best || stat > *stat_best) {
                        peer_best = peer;
                        stat_best = &stat;
                    }
                }
                m_headers_presync_bestpeer = peer_best;
                best_updated = (peer_best == pfrom.GetId());
            } else if (best_it->first == pfrom.GetId() || stats > best_it->second) {
                // pfrom was and remains the best peer, or pfrom just became best.
                m_headers_presync_bestpeer = pfrom.GetId();
                best_updated = true;
            }
            if (best_updated && stats.second.has_value()) {
                // If the best peer updated, and it is in its first phase, signal.
                m_headers_presync_should_signal = true;
            }
        }

        if (result.success) {
            // We only overwrite the headers passed in if processing was
            // successful.
            headers.swap(result.pow_validated_headers);
        }

        return result.success;
    }
    // Either we didn't have a sync in progress, or something went wrong
    // processing these headers, or we are returning headers to the caller to
    // process.
    return false;
}